

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::AppendVersion(VersionSet *this,Version *v)

{
  long lVar1;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Version *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RSI + 0x18) != 0) {
    __assert_fail("v->refs_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x2fb,"void leveldb::VersionSet::AppendVersion(Version *)");
  }
  if (in_RSI != *(long *)(in_RDI + 0x168)) {
    if (*(long *)(in_RDI + 0x168) != 0) {
      Version::Unref(in_stack_ffffffffffffffd8);
    }
    *(long *)(in_RDI + 0x168) = in_RSI;
    Version::Ref(in_stack_ffffffffffffffd8);
    *(undefined8 *)(in_RSI + 0x10) = *(undefined8 *)(in_RDI + 0x90);
    *(long *)(in_RSI + 8) = in_RDI + 0x80;
    *(long *)(*(long *)(in_RSI + 0x10) + 8) = in_RSI;
    *(long *)(*(long *)(in_RSI + 8) + 0x10) = in_RSI;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("v != current_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                ,0x2fc,"void leveldb::VersionSet::AppendVersion(Version *)");
}

Assistant:

void VersionSet::AppendVersion(Version* v) {
  // Make "v" current
  assert(v->refs_ == 0);
  assert(v != current_);
  if (current_ != nullptr) {
    current_->Unref();
  }
  current_ = v;
  v->Ref();

  // Append to linked list
  v->prev_ = dummy_versions_.prev_;
  v->next_ = &dummy_versions_;
  v->prev_->next_ = v;
  v->next_->prev_ = v;
}